

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_cast(lua_State *L)

{
  CTypeID CVar1;
  uint uVar2;
  TValue *o;
  void *pvVar3;
  ulong uVar4;
  CTState *cts;
  CType *d;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar1 = ffi_checkctype(L,cts,(TValue *)0x0);
  d = cts->tab + CVar1;
  o = lj_lib_checkany(L,2);
  L->top = o + 1;
  if (((0xfffffff < d->info) && (uVar2 = d->info >> 0x1c, uVar2 != 2)) && (uVar2 != 5)) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVTYPE);
  }
  if (((o->field_2).it != 0xfffffff5) || (CVar1 != *(ushort *)((ulong)(o->u32).lo + 6))) {
    pvVar3 = lj_mem_newgco(cts->L,d->size + 8);
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(short *)((long)pvVar3 + 6) = (short)CVar1;
    lj_cconv_ct_tv(cts,d,(uint8_t *)((long)pvVar3 + 8),o,1);
    (o->u32).lo = (uint32_t)pvVar3;
    (o->field_2).it = 0xfffffff5;
    uVar4 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar4 + 0x24) <= *(uint *)(uVar4 + 0x20)) {
      lj_gc_step(L);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}